

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int armci_msg_me(void)

{
  int iVar1;
  MPI_Comm poVar2;
  int rank;
  int local_c;
  
  iVar1 = comex_initialized();
  if (iVar1 == 0) {
    __assert_fail("comex_initialized()",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x237,"int armci_msg_me()");
  }
  poVar2 = wc();
  if (poVar2 != (MPI_Comm)&ompi_mpi_comm_null) {
    poVar2 = wc();
    MPI_Comm_rank(poVar2,&local_c);
    return local_c;
  }
  __assert_fail("wc() != MPI_COMM_NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x238,"int armci_msg_me()");
}

Assistant:

int armci_msg_me()
{
    int rank;
    assert(comex_initialized());
    assert(wc() != MPI_COMM_NULL);
    MPI_Comm_rank(wc(), &rank);
    return rank;
}